

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

void remove_range_closed_at(art_t *art,uint8_t *high48,uint16_t min,uint16_t max)

{
  ulong uVar1;
  byte bVar2;
  art_val_t *__ptr;
  array_container_t *run;
  byte bVar3;
  uint uVar4;
  rle16_t *prVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ushort uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint8_t typecode2;
  uint8_t local_59;
  ulong local_58;
  ulong local_50;
  uint8_t *local_48;
  ulong local_40;
  art_t *local_38;
  
  __ptr = art_find(art,high48);
  if (__ptr == (art_val_t *)0x0) {
    return;
  }
  run = *(array_container_t **)(__ptr[1].key + 2);
  uVar14 = (ulong)max;
  local_38 = art;
  if (__ptr[1].key[0] == '\x03') {
    iVar20 = run->cardinality;
    lVar10 = (long)iVar20;
    if ((lVar10 != 0) &&
       ((prVar5 = (rle16_t *)run->array, prVar5->value < min ||
        (max < (ushort)(prVar5[lVar10 + -1].length + prVar5[lVar10 + -1].value))))) {
      if (iVar20 < 1) {
        uVar14 = 0xffffffff;
        uVar19 = 0xffffffff;
LAB_00105926:
        uVar19 = ~uVar19;
LAB_00105929:
        uVar9 = (uint)uVar14;
        if ((int)uVar9 < 0) {
          uVar9 = -uVar9 - 2;
        }
        else {
          uVar11 = prVar5[uVar14].length + prVar5[uVar14].value;
          if (max < uVar11) {
            prVar5[uVar14].value = max + 1;
            prVar5[uVar14].length = uVar11 - (max + 1);
            uVar9 = uVar9 - 1;
          }
        }
        if ((int)uVar19 <= (int)uVar9) {
          uVar9 = ~uVar9;
          iVar16 = iVar20 + uVar9;
          iVar7 = uVar19 + uVar9;
          if ((iVar7 != 0 && SCARRY4(uVar19,uVar9) == iVar7 < 0) && (run->capacity < iVar7 + iVar16)
             ) {
            run_container_grow((run_container_t *)run,iVar7 + iVar16,true);
            iVar20 = run->cardinality;
            prVar5 = (rle16_t *)run->array;
          }
          memmove(prVar5 + ((iVar20 - iVar16) + iVar7),prVar5 + (iVar20 - iVar16),(long)iVar16 << 2)
          ;
          run->cardinality = run->cardinality + iVar7;
        }
      }
      else {
        iVar7 = iVar20 + -1;
        uVar19 = 0;
        iVar16 = iVar7;
        do {
          uVar9 = iVar16 + uVar19 >> 1;
          uVar17 = (ulong)uVar9;
          if ((ushort)(prVar5[uVar17].length + prVar5[uVar17].value) < min) {
            uVar19 = uVar9 + 1;
          }
          else {
            if (prVar5[uVar17].value <= min) goto LAB_0010560c;
            iVar16 = uVar9 - 1;
          }
        } while ((int)uVar19 <= iVar16);
        uVar17 = (ulong)~uVar19;
LAB_0010560c:
        uVar19 = (uint)uVar17;
        uVar9 = 0;
        do {
          uVar4 = iVar7 + uVar9 >> 1;
          uVar14 = (ulong)uVar4;
          if ((ushort)(prVar5[uVar14].length + prVar5[uVar14].value) < max) {
            uVar9 = uVar4 + 1;
          }
          else {
            if (prVar5[uVar14].value <= max) goto LAB_00105640;
            iVar7 = uVar4 - 1;
          }
        } while ((int)uVar9 <= iVar7);
        uVar14 = (ulong)~uVar9;
LAB_00105640:
        if ((int)uVar19 < 0) goto LAB_00105926;
        uVar11 = prVar5[uVar17].value;
        if (min <= uVar11) goto LAB_00105929;
        if ((uint)prVar5[uVar17].length + (uint)uVar11 <= (uint)max) {
          prVar5[uVar17].length = min + ~uVar11;
          uVar19 = uVar19 + 1;
          goto LAB_00105929;
        }
        uVar19 = uVar19 + 1;
        local_50 = uVar17;
        if (run->capacity <= iVar20) {
          run_container_grow((run_container_t *)run,iVar20 + 1,true);
          iVar20 = run->cardinality;
          prVar5 = (rle16_t *)run->array;
        }
        uVar9 = uVar19 & 0xffff;
        memmove(prVar5 + (ulong)uVar9 + 1,prVar5 + uVar9,(long)(int)(iVar20 - uVar9) << 2);
        run->cardinality = run->cardinality + 1;
        prVar5 = (rle16_t *)run->array;
        prVar5[uVar19].value = max + 1;
        uVar11 = prVar5[local_50].value;
        prVar5[uVar19].length = ~max + uVar11 + prVar5[local_50].length;
        prVar5[local_50].length = min + ~uVar11;
      }
      run = (array_container_t *)
            convert_run_to_efficient_container((run_container_t *)run,&local_59);
      goto LAB_00105b13;
    }
  }
  else if (__ptr[1].key[0] == '\x02') {
    prVar5 = (rle16_t *)run->array;
    uVar19 = run->cardinality;
    uVar9 = 0;
    if (uVar19 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = uVar19;
      uVar9 = 0;
      if (0 < (int)uVar19) {
        iVar20 = uVar19 - 1;
        iVar16 = 0;
        do {
          uVar15 = (uint)(iVar20 + iVar16) >> 1;
          uVar11 = *(ushort *)((long)&prVar5->value + (ulong)(iVar20 + iVar16 & 0xfffffffe));
          if (uVar11 < max) {
            iVar16 = uVar15 + 1;
          }
          else {
            if (uVar11 <= max) {
              uVar6 = ~uVar15;
              uVar4 = uVar19 + uVar6;
              uVar9 = 0xffffffff;
              if (uVar15 != 0x7fffffff) goto LAB_001059db;
              goto LAB_00105a07;
            }
            iVar20 = uVar15 - 1;
          }
        } while (iVar16 <= iVar20);
        iVar20 = -iVar16;
        if (0 < iVar16) {
          iVar20 = iVar16;
        }
        uVar4 = uVar19 - iVar20;
        if (iVar16 == 0) {
          uVar9 = 0;
        }
        else {
          uVar6 = -iVar20;
LAB_001059db:
          uVar6 = ~uVar6;
          uVar15 = 0;
          do {
            uVar9 = uVar6 + uVar15 >> 1;
            uVar11 = *(ushort *)((long)&prVar5->value + (ulong)(uVar6 + uVar15 & 0xfffffffe));
            if (uVar11 < min) {
              uVar15 = uVar9 + 1;
            }
            else {
              if (uVar11 <= min) goto LAB_00105a07;
              uVar6 = uVar9 - 1;
            }
          } while ((int)uVar15 <= (int)uVar6);
          uVar9 = ~uVar15;
LAB_00105a07:
          uVar9 = (int)uVar9 >> 0x1f ^ uVar9;
        }
      }
    }
    if (uVar9 + uVar4 != 0) {
      local_59 = '\x02';
      iVar20 = uVar19 - (uVar9 + uVar4);
      if (iVar20 != 0) {
        memmove(&prVar5->value + uVar9,&prVar5->value + (uVar9 + iVar20),(ulong)uVar4 * 2);
        run->cardinality = run->cardinality - iVar20;
      }
      goto LAB_00105b13;
    }
  }
  else {
    prVar5 = (rle16_t *)run->array;
    uVar11 = min >> 6;
    uVar1 = (ulong)uVar11;
    uVar8 = (ulong)(max >> 6);
    uVar17 = *(ulong *)(prVar5 + uVar1 * 2);
    uVar9 = (uint)(max >> 6);
    uVar19 = (uint)uVar11;
    bVar3 = (byte)min;
    bVar2 = (byte)max;
    if (uVar9 == uVar19) {
      uVar12 = (0xffffffffffffffffU >> (~bVar2 + bVar3 & 0x3f)) << (bVar3 & 0x3f) & uVar17;
      uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
      uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
      uVar4 = (uint)(byte)(((uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
      ;
    }
    else {
      local_50 = CONCAT44(local_50._4_4_,run->cardinality);
      uVar12 = (uVar17 >> (bVar3 & 0x3f)) << (bVar3 & 0x3f);
      uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
      uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
      uVar12 = ((uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      uVar13 = uVar12 >> 0x38;
      uVar4 = (uint)(byte)(uVar12 >> 0x38);
      if (uVar19 + 1 < uVar9) {
        uVar12 = (ulong)(uVar19 + 1);
        do {
          uVar18 = *(ulong *)(prVar5 + uVar12 * 2) -
                   (*(ulong *)(prVar5 + uVar12 * 2) >> 1 & 0x5555555555555555);
          uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
          uVar4 = (int)uVar13 +
                  (uint)(byte)(((uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x38);
          uVar13 = (ulong)uVar4;
          uVar12 = uVar12 + 1;
          local_58 = uVar14;
          local_48 = high48;
        } while (uVar8 != uVar12);
      }
      uVar12 = (ulong)(*(long *)(prVar5 + uVar8 * 2) << (~bVar2 & 0x3f)) >> (~bVar2 & 0x3f);
      uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
      uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
      uVar4 = (byte)(((uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
              uVar4;
      local_40 = uVar17;
    }
    iVar20 = run->cardinality - uVar4;
    if (iVar20 != 0) {
      uVar4 = (uint)uVar11;
      if (iVar20 < 0x1001) {
        local_59 = '\x02';
        if (max + 1 != (uint)min) {
          uVar12 = -1L << (bVar3 & 0x3f);
          if (uVar9 == uVar4) {
            uVar14 = (uVar12 << (~bVar2 & 0x3f)) >> (~bVar2 & 0x3f);
            uVar8 = uVar1;
          }
          else {
            *(ulong *)(prVar5 + uVar1 * 2) = uVar17 & ~uVar12;
            if (uVar4 + 1 < uVar9) {
              local_58 = uVar14;
              memset(prVar5 + uVar1 * 2 + 2,0,(ulong)((uVar9 - uVar4) - 2) * 8 + 8);
              uVar14 = local_58;
            }
            uVar14 = 0xffffffffffffffff >> (~(byte)uVar14 & 0x3f);
            uVar17 = *(ulong *)(prVar5 + uVar8 * 2);
          }
          *(ulong *)(prVar5 + uVar8 * 2) = ~uVar14 & uVar17;
        }
        run->cardinality = iVar20;
        run = array_container_from_bitset((bitset_container_t *)run);
      }
      else {
        local_59 = '\x01';
        if (max + 1 != (uint)min) {
          uVar12 = -1L << (bVar3 & 0x3f);
          if (uVar9 == uVar19) {
            uVar14 = (uVar12 << (~bVar2 & 0x3f)) >> (~bVar2 & 0x3f);
            uVar8 = uVar1;
          }
          else {
            *(ulong *)(prVar5 + uVar1 * 2) = uVar17 & ~uVar12;
            if (uVar4 + 1 < uVar9) {
              local_58 = uVar14;
              memset(prVar5 + uVar1 * 2 + 2,0,(ulong)((uVar9 - uVar4) - 2) * 8 + 8);
              uVar14 = local_58;
            }
            uVar14 = 0xffffffffffffffff >> (~(byte)uVar14 & 0x3f);
            uVar17 = *(ulong *)(prVar5 + uVar8 * 2);
          }
          *(ulong *)(prVar5 + uVar8 * 2) = ~uVar14 & uVar17;
        }
        run->cardinality = iVar20;
      }
      goto LAB_00105b13;
    }
  }
  run = (array_container_t *)0x0;
LAB_00105b13:
  if (run != *(array_container_t **)(__ptr[1].key + 2)) {
    container_free(*(array_container_t **)(__ptr[1].key + 2),__ptr[1].key[0]);
    if (run == (array_container_t *)0x0) {
      art_erase(local_38,high48);
      roaring_free(__ptr);
    }
    else {
      *(array_container_t **)(__ptr[1].key + 2) = run;
      __ptr[1].key[0] = local_59;
    }
  }
  return;
}

Assistant:

static inline void remove_range_closed_at(art_t *art, uint8_t *high48,
                                          uint16_t min, uint16_t max) {
    leaf_t *leaf = (leaf_t *)art_find(art, high48);
    if (leaf == NULL) {
        return;
    }
    uint8_t typecode2;
    container_t *container2 = container_remove_range(
        leaf->container, leaf->typecode, min, max, &typecode2);
    if (container2 != leaf->container) {
        container_free(leaf->container, leaf->typecode);
        if (container2 != NULL) {
            leaf->container = container2;
            leaf->typecode = typecode2;
        } else {
            art_erase(art, high48);
            free_leaf(leaf);
        }
    }
}